

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::GenerateGraphViz(cmake *this,string *fileName)

{
  string *psVar1;
  string fallbackSettingsFile;
  string settingsFile;
  cmGraphVizWriter gvWriter;
  string sStack_4c8;
  string local_4a8;
  cmAlphaNum local_488;
  cmAlphaNum local_458;
  cmGraphVizWriter local_428;
  
  cmGraphVizWriter::cmGraphVizWriter
            (&local_428,fileName,
             (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
  psVar1 = GetHomeOutputDirectory_abi_cxx11_(this);
  local_458.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_458.View_._M_len = psVar1->_M_string_length;
  local_488.View_._M_len = 0x1b;
  local_488.View_._M_str = "/CMakeGraphVizOptions.cmake";
  cmStrCat<>(&local_4a8,&local_458,&local_488);
  psVar1 = GetHomeDirectory_abi_cxx11_(this);
  local_458.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_458.View_._M_len = psVar1->_M_string_length;
  local_488.View_._M_len = 0x1b;
  local_488.View_._M_str = "/CMakeGraphVizOptions.cmake";
  cmStrCat<>(&sStack_4c8,&local_458,&local_488);
  cmGraphVizWriter::ReadSettings(&local_428,&local_4a8,&sStack_4c8);
  cmGraphVizWriter::Write(&local_428);
  std::__cxx11::string::~string((string *)&sStack_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  cmGraphVizWriter::~cmGraphVizWriter(&local_428);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const std::string& fileName) const
{
#ifndef CMAKE_BOOTSTRAP
  cmGraphVizWriter gvWriter(fileName, this->GetGlobalGenerator());

  std::string settingsFile =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeGraphVizOptions.cmake");
  std::string fallbackSettingsFile =
    cmStrCat(this->GetHomeDirectory(), "/CMakeGraphVizOptions.cmake");

  gvWriter.ReadSettings(settingsFile, fallbackSettingsFile);

  gvWriter.Write();

#endif
}